

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

bool __thiscall
QWidgetTextControlPrivate::cursorMoveKeyEvent(QWidgetTextControlPrivate *this,QKeyEvent *e)

{
  QTextCursor *cursor;
  long lVar1;
  QWidgetTextControl *this_00;
  char cVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  MoveMode MVar7;
  MoveMode MVar8;
  long in_FS_OFFSET;
  QTextLine QVar9;
  bool local_7c;
  QTextCursor oldSelection;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetTextControl **)&this->field_0x8;
  cursor = &this->cursor;
  cVar2 = QTextCursor::isNull();
  bVar3 = false;
  if (cVar2 != '\0') goto LAB_0047a0d6;
  _oldSelection = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::QTextCursor(&oldSelection,cursor);
  iVar5 = QTextCursor::position();
  bVar3 = ::operator==(e,MoveToNextChar);
  MVar8 = 0x13;
  if (bVar3) {
LAB_0047a040:
    local_7c = false;
    MVar7 = MoveAnchor;
LAB_0047a042:
    QTextCursor::visualNavigation();
    QTextCursor::setVisualNavigation(SUB81(cursor,0));
    cVar2 = QTextCursor::movePosition((MoveOperation)cursor,MVar8,MVar7);
    QTextCursor::setVisualNavigation(SUB81(cursor,0));
    (**(code **)(*(long *)this_00 + 0x60))(this_00);
    if (cVar2 == '\0') {
      if ((*(int *)(e + 0x40) + 0xfeffffeeU < 4) && (this->ignoreUnusedNavigationEvents != false)) {
        iVar5 = QTextCursor::anchor();
        iVar6 = QTextCursor::anchor();
        if (iVar5 == iVar6) {
          bVar3 = false;
          goto LAB_0047a0cc;
        }
      }
    }
    else {
      iVar6 = QTextCursor::position();
      if (iVar6 != iVar5) {
        QWidgetTextControl::cursorPositionChanged(this_00);
      }
      QWidgetTextControl::microFocusChanged(this_00);
    }
    selectionChanged(this,local_7c);
    repaintOldAndNewSelection(this,&oldSelection);
    bVar3 = true;
  }
  else {
    bVar3 = ::operator==(e,MoveToPreviousChar);
    MVar8 = 9;
    if (bVar3) goto LAB_0047a040;
    bVar3 = ::operator==(e,SelectNextChar);
    MVar7 = KeepAnchor;
    local_7c = true;
    MVar8 = 0x13;
    if ((bVar3) || (bVar3 = ::operator==(e,SelectPreviousChar), MVar8 = 9, bVar3))
    goto LAB_0047a042;
    bVar3 = ::operator==(e,SelectNextWord);
    MVar8 = 0x14;
    if (bVar3) goto LAB_0047a042;
    bVar3 = ::operator==(e,SelectPreviousWord);
    MVar8 = 10;
    if (bVar3) goto LAB_0047a042;
    bVar3 = ::operator==(e,SelectStartOfLine);
    MVar8 = 3;
    if (bVar3) {
LAB_0047a1e5:
      MVar7 = KeepAnchor;
      goto LAB_0047a042;
    }
    bVar3 = ::operator==(e,SelectEndOfLine);
    MVar8 = 0xd;
    if (bVar3) goto LAB_0047a1e5;
    bVar3 = ::operator==(e,SelectStartOfBlock);
    MVar8 = 4;
    if (bVar3) goto LAB_0047a1e5;
    bVar3 = ::operator==(e,SelectEndOfBlock);
    MVar8 = 0xf;
    if (bVar3) goto LAB_0047a1e5;
    bVar3 = ::operator==(e,SelectStartOfDocument);
    MVar7 = KeepAnchor;
    MVar8 = MVar7;
    if (bVar3) goto LAB_0047a042;
    bVar3 = ::operator==(e,SelectEndOfDocument);
    MVar8 = 0xb;
    if (bVar3) goto LAB_0047a1e5;
    bVar3 = ::operator==(e,SelectPreviousLine);
    if (bVar3) {
      QTextCursor::block();
      QVar9 = currentTextLine(cursor);
      QTextBlock::previous();
      cVar2 = QTextBlock::isValid();
      if (QVar9.eng == (QTextEngine *)0x0 || cVar2 != '\0') {
        MVar8 = 2;
      }
      else {
        MVar8 = 2 - (QVar9.index == 0);
      }
LAB_0047a3c3:
      MVar7 = KeepAnchor;
      goto LAB_0047a042;
    }
    bVar3 = ::operator==(e,SelectNextLine);
    if (bVar3) {
      QTextCursor::block();
      QVar9 = currentTextLine(cursor);
      QTextBlock::next();
      cVar2 = QTextBlock::isValid();
      if (QVar9.eng == (QTextEngine *)0x0 || cVar2 != '\0') {
        MVar8 = 0xc;
      }
      else {
        QTextBlock::layout();
        iVar6 = QTextLayout::lineCount();
        MVar8 = (QVar9.index != iVar6 + -1) + 0xb;
      }
      goto LAB_0047a3c3;
    }
    bVar3 = ::operator==(e,MoveToNextWord);
    local_7c = false;
    MVar7 = MoveAnchor;
    MVar8 = 0x14;
    if (bVar3) goto LAB_0047a042;
    bVar3 = ::operator==(e,MoveToPreviousWord);
    local_7c = false;
    MVar7 = MoveAnchor;
    MVar8 = 10;
    if (bVar3) goto LAB_0047a042;
    bVar3 = ::operator==(e,MoveToEndOfBlock);
    local_7c = false;
    MVar7 = MoveAnchor;
    MVar8 = 0xf;
    if (bVar3) goto LAB_0047a042;
    bVar3 = ::operator==(e,MoveToStartOfBlock);
    local_7c = false;
    MVar7 = MoveAnchor;
    MVar8 = 4;
    if (bVar3) goto LAB_0047a042;
    bVar3 = ::operator==(e,MoveToNextLine);
    if (bVar3) {
      MVar8 = 0xc;
      goto LAB_0047a040;
    }
    bVar3 = ::operator==(e,MoveToPreviousLine);
    if (bVar3) {
      MVar8 = 2;
      goto LAB_0047a040;
    }
    bVar3 = ::operator==(e,MoveToStartOfLine);
    local_7c = false;
    MVar7 = MoveAnchor;
    MVar8 = 3;
    if (bVar3) goto LAB_0047a042;
    bVar3 = ::operator==(e,MoveToEndOfLine);
    local_7c = false;
    MVar7 = MoveAnchor;
    MVar8 = 0xd;
    if (bVar3) goto LAB_0047a042;
    bVar3 = ::operator==(e,MoveToStartOfDocument);
    local_7c = false;
    MVar7 = MoveAnchor;
    MVar8 = KeepAnchor;
    if (bVar3) goto LAB_0047a042;
    bVar4 = ::operator==(e,MoveToEndOfDocument);
    local_7c = false;
    MVar7 = MoveAnchor;
    bVar3 = false;
    MVar8 = 0xb;
    if (bVar4) goto LAB_0047a042;
  }
LAB_0047a0cc:
  QTextCursor::~QTextCursor(&oldSelection);
LAB_0047a0d6:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool QWidgetTextControlPrivate::cursorMoveKeyEvent(QKeyEvent *e)
{
#ifdef QT_NO_SHORTCUT
    Q_UNUSED(e);
#endif

    Q_Q(QWidgetTextControl);
    if (cursor.isNull())
        return false;

    const QTextCursor oldSelection = cursor;
    const int oldCursorPos = cursor.position();

    QTextCursor::MoveMode mode = QTextCursor::MoveAnchor;
    QTextCursor::MoveOperation op = QTextCursor::NoMove;

    if (false) {
    }
#ifndef QT_NO_SHORTCUT
    if (e == QKeySequence::MoveToNextChar) {
            op = QTextCursor::Right;
    }
    else if (e == QKeySequence::MoveToPreviousChar) {
            op = QTextCursor::Left;
    }
    else if (e == QKeySequence::SelectNextChar) {
           op = QTextCursor::Right;
           mode = QTextCursor::KeepAnchor;
    }
    else if (e == QKeySequence::SelectPreviousChar) {
            op = QTextCursor::Left;
            mode = QTextCursor::KeepAnchor;
    }
    else if (e == QKeySequence::SelectNextWord) {
            op = QTextCursor::WordRight;
            mode = QTextCursor::KeepAnchor;
    }
    else if (e == QKeySequence::SelectPreviousWord) {
            op = QTextCursor::WordLeft;
            mode = QTextCursor::KeepAnchor;
    }
    else if (e == QKeySequence::SelectStartOfLine) {
            op = QTextCursor::StartOfLine;
            mode = QTextCursor::KeepAnchor;
    }
    else if (e == QKeySequence::SelectEndOfLine) {
            op = QTextCursor::EndOfLine;
            mode = QTextCursor::KeepAnchor;
    }
    else if (e == QKeySequence::SelectStartOfBlock) {
            op = QTextCursor::StartOfBlock;
            mode = QTextCursor::KeepAnchor;
    }
    else if (e == QKeySequence::SelectEndOfBlock) {
            op = QTextCursor::EndOfBlock;
            mode = QTextCursor::KeepAnchor;
    }
    else if (e == QKeySequence::SelectStartOfDocument) {
            op = QTextCursor::Start;
            mode = QTextCursor::KeepAnchor;
    }
    else if (e == QKeySequence::SelectEndOfDocument) {
            op = QTextCursor::End;
            mode = QTextCursor::KeepAnchor;
    }
    else if (e == QKeySequence::SelectPreviousLine) {
            op = QTextCursor::Up;
            mode = QTextCursor::KeepAnchor;
            {
                QTextBlock block = cursor.block();
                QTextLine line = currentTextLine(cursor);
                if (!block.previous().isValid()
                    && line.isValid()
                    && line.lineNumber() == 0)
                    op = QTextCursor::Start;
            }
    }
    else if (e == QKeySequence::SelectNextLine) {
            op = QTextCursor::Down;
            mode = QTextCursor::KeepAnchor;
            {
                QTextBlock block = cursor.block();
                QTextLine line = currentTextLine(cursor);
                if (!block.next().isValid()
                    && line.isValid()
                    && line.lineNumber() == block.layout()->lineCount() - 1)
                    op = QTextCursor::End;
            }
    }
    else if (e == QKeySequence::MoveToNextWord) {
            op = QTextCursor::WordRight;
    }
    else if (e == QKeySequence::MoveToPreviousWord) {
            op = QTextCursor::WordLeft;
    }
    else if (e == QKeySequence::MoveToEndOfBlock) {
            op = QTextCursor::EndOfBlock;
    }
    else if (e == QKeySequence::MoveToStartOfBlock) {
            op = QTextCursor::StartOfBlock;
    }
    else if (e == QKeySequence::MoveToNextLine) {
            op = QTextCursor::Down;
    }
    else if (e == QKeySequence::MoveToPreviousLine) {
            op = QTextCursor::Up;
    }
    else if (e == QKeySequence::MoveToStartOfLine) {
            op = QTextCursor::StartOfLine;
    }
    else if (e == QKeySequence::MoveToEndOfLine) {
            op = QTextCursor::EndOfLine;
    }
    else if (e == QKeySequence::MoveToStartOfDocument) {
            op = QTextCursor::Start;
    }
    else if (e == QKeySequence::MoveToEndOfDocument) {
            op = QTextCursor::End;
    }
#endif // QT_NO_SHORTCUT
    else {
        return false;
    }

// Except for pageup and pagedown, OS X has very different behavior, we don't do it all, but
// here's the breakdown:
// Shift still works as an anchor, but only one of the other keys can be down Ctrl (Command),
// Alt (Option), or Meta (Control).
// Command/Control + Left/Right -- Move to left or right of the line
//                 + Up/Down -- Move to top bottom of the file. (Control doesn't move the cursor)
// Option + Left/Right -- Move one word Left/right.
//        + Up/Down  -- Begin/End of Paragraph.
// Home/End Top/Bottom of file. (usually don't move the cursor, but will select)

    bool visualNavigation = cursor.visualNavigation();
    cursor.setVisualNavigation(true);
    const bool moved = cursor.movePosition(op, mode);
    cursor.setVisualNavigation(visualNavigation);
    q->ensureCursorVisible();

    bool ignoreNavigationEvents = ignoreUnusedNavigationEvents;
    bool isNavigationEvent = e->key() == Qt::Key_Up || e->key() == Qt::Key_Down;

#ifdef QT_KEYPAD_NAVIGATION
    ignoreNavigationEvents = ignoreNavigationEvents || QApplicationPrivate::keypadNavigationEnabled();
    isNavigationEvent = isNavigationEvent ||
                        (QApplication::navigationMode() == Qt::NavigationModeKeypadDirectional
                         && (e->key() == Qt::Key_Left || e->key() == Qt::Key_Right));
#else
    isNavigationEvent = isNavigationEvent || e->key() == Qt::Key_Left || e->key() == Qt::Key_Right;
#endif

    if (moved) {
        if (cursor.position() != oldCursorPos)
            emit q->cursorPositionChanged();
        emit q->microFocusChanged();
    } else if (ignoreNavigationEvents && isNavigationEvent && oldSelection.anchor() == cursor.anchor()) {
        return false;
    }

    selectionChanged(/*forceEmitSelectionChanged =*/(mode == QTextCursor::KeepAnchor));

    repaintOldAndNewSelection(oldSelection);

    return true;
}